

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O1

size_t __thiscall
Memory::LargeHeapBlock::RescanMultiPage(LargeHeapBlock *this,Recycler *recycler,RescanFlags flags)

{
  MarkContext *this_00;
  size_t *psVar1;
  size_t *psVar2;
  bool bVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  bool bVar8;
  undefined4 *puVar9;
  LargeHeapBlock *this_01;
  ushort uVar10;
  uint uVar11;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *pcVar12;
  char *this_02;
  byte bVar13;
  byte bVar14;
  char *pcVar15;
  size_t *psVar17;
  uint index;
  char *local_78;
  size_t local_60;
  size_t local_48;
  size_t *psVar16;
  
  if (this->pageCount == 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x56c,"(this->GetPageCount() != 1)","this->GetPageCount() != 1");
    if (!bVar5) {
LAB_006f2ad8:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  bVar5 = (this->super_HeapBlock).needOOMRescan;
  (this->super_HeapBlock).needOOMRescan = false;
  index = 0;
  if (this->allocCount == 0) {
    local_48 = 0;
  }
  else {
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    this_00 = &recycler->markContext;
    local_48 = 0;
    local_78 = (char *)0x0;
    bVar8 = false;
    do {
      this_01 = (LargeHeapBlock *)GetHeaderByIndex(this,index);
      bVar14 = 0;
      if (this_01 != (LargeHeapBlock *)0x0) {
        psVar16 = &this_01->pageCount;
        bVar6 = HeapBlockMap64::IsMarked(&recycler->heapBlockMap,psVar16);
        if (bVar6) {
          this_02 = (char *)this_01;
          bVar7 = LargeObjectHeader::GetAttributes((LargeObjectHeader *)this_01,recycler->Cookie);
          if ((bVar7 & 4) != 0 && (char)bVar7 < '\0') {
            psVar2 = &(recycler->collectionStats).finalizeCount;
            *psVar2 = *psVar2 + 1;
            uVar11 = *(uint *)&(this_01->super_HeapBlock).segment ^ recycler->Cookie;
            uVar11 = uVar11 >> 0x18 ^ uVar11 ^ uVar11 >> 0x10 ^ uVar11 >> 8;
            uVar11 = CONCAT31((int3)(uVar11 >> 8),(byte)uVar11 ^ bVar7 & 0xfb);
            this_02 = (char *)(ulong)uVar11;
            uVar10 = ((ushort)uVar11 & 0xff | (ushort)(bVar7 & 0xfb) << 8) ^
                     (ushort)recycler->Cookie;
            (this_01->super_HeapBlock).heapBlockType = (char)uVar10;
            (this_01->super_HeapBlock).needOOMRescan = (bool)(char)(uVar10 >> 8);
          }
          if ((bVar7 & 0x20) == 0) {
            if (this->pageHeapData == (PageHeapData *)0x0) {
              bVar6 = false;
            }
            else {
              bVar6 = this->pageHeapData->pageHeapMode != PageHeapModeOff;
            }
            pcVar12 = (this_01->super_HeapBlock).address;
            pcVar15 = (char *)((ulong)pcVar12 & 0xfffffffffffffff8);
            if (!bVar6) {
              pcVar15 = pcVar12;
            }
            pcVar12 = pcVar15;
            if (pcVar15 == (char *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              this_02 = 
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
              ;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                                 ,0x5af,"(objectSize > 0)","objectSize > 0");
              if (!bVar6) goto LAB_006f2ad8;
              *puVar9 = 0;
              pcVar12 = extraout_RDX;
            }
            if ((bVar5 == false) &&
               (((this_01->super_HeapBlock).isPendingConcurrentSweep & 1U) != 0)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar9 = 1;
              this_02 = 
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
              ;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                                 ,0x5b0,"(oldNeedOOMRescan || !header->markOnOOMRescan)",
                                 "oldNeedOOMRescan || !header->markOnOOMRescan");
              if (!bVar6) goto LAB_006f2ad8;
              *puVar9 = 0;
              pcVar12 = extraout_RDX_00;
            }
            if (((this_01->super_HeapBlock).isPendingConcurrentSweep & 1U) == 0) {
              if (recycler->inEndMarkOnLowMemory == false) {
                psVar2 = (size_t *)(pcVar15 + (long)psVar16);
                bVar13 = 0;
                do {
                  pcVar15 = (char *)((ulong)psVar16 & 0xfffffffffffff000);
                  if (local_78 != pcVar15) {
                    bVar8 = IsPageDirty((LargeHeapBlock *)this_02,pcVar15,(RescanFlags)pcVar12,
                                        (bool)(((this_01->super_HeapBlock).isPendingConcurrentSweep
                                               & 2U) >> 1));
                    pcVar12 = extraout_RDX_01;
                    local_78 = pcVar15;
                  }
                  psVar17 = (size_t *)(pcVar15 + 0x1000);
                  if (bVar8 != false) {
                    if (psVar2 <= psVar17) {
                      psVar17 = psVar2;
                    }
                    if ((bVar7 & 0x10) != 0) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      *puVar9 = 1;
                      bVar6 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                                         ,0x641,"(!(attributes & TrackBit))",
                                         "!(attributes & TrackBit)");
                      if (!bVar6) goto LAB_006f2ad8;
                      *puVar9 = 0;
                    }
                    if ((recycler->collectionState).value == CollectionStateParallelMark) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      *puVar9 = 1;
                      bVar6 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                                         ,0x206,
                                         "(this->collectionState != CollectionStateParallelMark)",
                                         "this->collectionState != CollectionStateParallelMark");
                      if (!bVar6) goto LAB_006f2ad8;
                      *puVar9 = 0;
                    }
                    this_02 = (char *)this_00;
                    bVar6 = MarkContext::AddMarkedObject
                                      (this_00,psVar16,(long)psVar17 - (long)psVar16);
                    pcVar12 = extraout_RDX_02;
                    if (!bVar6) {
                      this_02 = (char *)this;
                      HeapBlock::SetNeedOOMRescan(&this->super_HeapBlock,recycler);
                      bVar6 = (this_01->super_HeapBlock).isPendingConcurrentSweep;
                      pcVar12 = extraout_RDX_03;
                      if ((bVar6 & 4U) == 0) {
                        (this_01->super_HeapBlock).isPendingConcurrentSweep = (bool)(bVar6 | 1);
                      }
                    }
                    psVar1 = &(recycler->collectionStats).markData.rescanLargePageCount;
                    *psVar1 = *psVar1 + 1;
                    psVar1 = &(recycler->collectionStats).markData.rescanLargeByteCount;
                    *psVar1 = *psVar1 + ((long)psVar17 - (long)psVar16);
                    local_48 = local_48 + 1;
                    bVar13 = 1;
                  }
                  psVar16 = psVar17;
                } while (psVar17 < psVar2);
              }
              else {
                bVar13 = 0;
              }
            }
            else {
              if ((bVar7 & 0x10) != 0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar9 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                                   ,0x5c3,"(!(attributes & TrackBit))","!(attributes & TrackBit)");
                if (!bVar6) goto LAB_006f2ad8;
                *puVar9 = 0;
              }
              if ((recycler->collectionState).value == CollectionStateParallelMark) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar9 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                                   ,0x206,"(this->collectionState != CollectionStateParallelMark)",
                                   "this->collectionState != CollectionStateParallelMark");
                if (!bVar6) goto LAB_006f2ad8;
                *puVar9 = 0;
              }
              bVar6 = MarkContext::AddMarkedObject(this_00,psVar16,(size_t)pcVar15);
              if (bVar6) {
                bVar3 = (this_01->super_HeapBlock).isPendingConcurrentSweep;
                bVar13 = 1;
                bVar14 = 0;
                if ((bVar3 & 4U) == 0) {
                  (this_01->super_HeapBlock).isPendingConcurrentSweep = (bool)(bVar3 & 0xfa);
                }
              }
              else {
                HeapBlock::SetNeedOOMRescan(&this->super_HeapBlock,recycler);
                bVar3 = (this_01->super_HeapBlock).isPendingConcurrentSweep;
                if ((bVar3 & 4U) == 0) {
                  (this_01->super_HeapBlock).isPendingConcurrentSweep = (bool)(bVar3 | 1);
                }
                bVar14 = (recycler->inEndMarkOnLowMemory ^ 1U) * '\x03' + 1;
                if (recycler->inEndMarkOnLowMemory != false) {
                  local_60 = local_48;
                }
                bVar13 = 0;
              }
              if (!bVar6) goto LAB_006f2a99;
            }
            psVar16 = &(recycler->collectionStats).markData.rescanLargeObjectCount;
            *psVar16 = *psVar16 + (ulong)bVar13;
            bVar14 = 0;
          }
        }
      }
LAB_006f2a99:
      if ((bVar14 & 3) != 0) {
        return local_60;
      }
      index = index + 1;
    } while (index < this->allocCount);
  }
  return local_48;
}

Assistant:

size_t
LargeHeapBlock::RescanMultiPage(Recycler * recycler)
#endif
{
    Assert(this->GetPageCount() != 1);
    DebugOnly(bool oldNeedOOMRescan = this->needOOMRescan);

    // Reset this, we'll increment this if we OOM again
    this->needOOMRescan = false;

    size_t rescanCount = 0;
    uint objectIndex = 0;
#if ENABLE_CONCURRENT_GC
    char * lastPageCheckedForWriteWatch = nullptr;
    bool isLastPageCheckedForWriteWatchDirty = false;
#endif

    const HeapBlockMap& heapBlockMap = recycler->heapBlockMap;

    while (objectIndex < allocCount)
    {
        // object is allocated during the concurrent mark or it is marked, do rescan
        LargeObjectHeader * header = this->GetHeaderByIndex(objectIndex);
        objectIndex++;

        // check if the object index is not allocated
        if (header == nullptr)
        {
            continue;
        }

        char * objectAddress = (char *)header->GetAddress();

        // it is not marked, don't rescan
        if (!heapBlockMap.IsMarked(objectAddress))
        {
            continue;
        }

        unsigned char attributes = header->GetAttributes(recycler->Cookie);

#ifdef RECYCLER_STATS
        if (((attributes & FinalizeBit) != 0) && ((attributes & NewFinalizeBit) != 0))
        {
            // The concurrent thread saw a false reference to this object and marked it before the attribute was set.
            // As such, our finalizeCount is not correct.  Update it now.

            RECYCLER_STATS_INC(recycler, finalizeCount);
            header->SetAttributes(recycler->Cookie, (attributes & ~NewFinalizeBit));
        }
#endif

        // check whether the object is a leaf and doesn't need to be scanned
        if ((attributes & LeafBit) != 0)
        {
            continue;
        }

#ifdef RECYCLER_STATS
        bool objectScanned = false;
#endif

        size_t objectSize = header->objectSize;
#ifdef RECYCLER_PAGE_HEAP
        if (this->InPageHeapMode())
        {
            // trim off the trailing part which is not a pointer
            objectSize = HeapInfo::RoundObjectSize(objectSize);
        }
#endif

        Assert(objectSize > 0);
        Assert(oldNeedOOMRescan || !header->markOnOOMRescan);
        // Avoid writing to the page unnecessary by checking first
        if (header->markOnOOMRescan)
        {
            bool noOOMDuringMark = true;
#ifdef RECYCLER_VISITED_HOST
            if (attributes & TrackBit)
            {
                noOOMDuringMark = recycler->AddPreciselyTracedMark(reinterpret_cast<IRecyclerVisitedObject*>(objectAddress));
                if (noOOMDuringMark)
                {
                    // Object has been successfully processed, so clear NewTrackBit
                    header->SetAttributes(recycler->Cookie, (attributes & ~NewTrackBit));
                    RECYCLER_STATS_INTERLOCKED_INC(recycler, trackCount);
                }
            }
            else
#endif
            {
                Assert(!(attributes & TrackBit));
                noOOMDuringMark = recycler->AddMark(objectAddress, objectSize);
            }

            if (!noOOMDuringMark)
            {
                this->SetNeedOOMRescan(recycler);
#ifdef RECYCLER_PAGE_HEAP
                if (!header->isObjectPageLocked)
#endif
                {
                    header->markOnOOMRescan = true;
                }

                // We need to bail out of rescan early only if the recycler is
                // trying to finish marking because of low memory. If this is
                // a regular rescan, we want to try and rescan all the objects
                // on the page. It's possible that the rescan OOMs but if the
                // object rescan does OOM, we'll set the right bit on the
                // object header. When we later rescan it in a low memory
                // situation, when the bit is set, we don't need to check for
                // write-watch etc. since we'd have already done that before
                // setting the bit in the non-low-memory rescan case.
                if (!recycler->inEndMarkOnLowMemory)
                {
                    continue;
                }

                return rescanCount;
            }
#ifdef RECYCLER_PAGE_HEAP
            if (!header->isObjectPageLocked)
#endif
            {
                header->markOnOOMRescan = false;
            }
#ifdef RECYCLER_STATS
            objectScanned = true;
#endif
        }
#if ENABLE_CONCURRENT_GC
        else if (!recycler->inEndMarkOnLowMemory)
        {
            char * objectAddressEnd = objectAddress + objectSize;
            // Walk through the object, checking if any of its pages have been written to
            // If it has, then queue up this object for marking
#ifdef RECYCLER_VISITED_HOST
            bool tracedObject = attributes & TrackBit;
            char * objectAddressStart = objectAddress;
#endif
            do
            {
                char * pageStart = (char *)(((size_t)objectAddress) & ~(size_t)(AutoSystemInfo::PageSize - 1));

                /*
                * The rescan logic for large conservatively scanned object is as follows:
                *  - We rescan the object if it was marked during concurrent mark
                *  - If it was marked, since the large object has multiple pages, we'll rescan only the parts that were changed
                *  - So for each page in the large object, check if it's been written to, and if it hasn't, skip looking at that region
                *  - If we can't get the write watch, rescan that region
                *  - However, this logic applies only if we're not rescanning because of an OOM
                *  - If we are rescanning this object because of OOM (i.e !rescanBecauseOfOOM = false), rescan the whole object
                * For large traced objects we rescan the object and if one of its pages has changed we will rescan the entire object
                *
                * We cache the result of the write watch and the page that it was checked on so that we don't call GetWriteWatch on the same
                * page twice and inadvertently reset the write watch on a page where we've already scanned an object
                */
                if (lastPageCheckedForWriteWatch != pageStart)
                {
                    lastPageCheckedForWriteWatch = pageStart;
                    isLastPageCheckedForWriteWatchDirty = true;
                    bool hasWriteBarrier = false;
#ifdef RECYCLER_WRITE_BARRIER
                    hasWriteBarrier = header->hasWriteBarrier;
#endif
                    if (!IsPageDirty(pageStart, flags, hasWriteBarrier))
                    {
                        // Fall through to the case below where we'll update objectAddress and continue
                        isLastPageCheckedForWriteWatchDirty = false;
                    }
                }

                if (!isLastPageCheckedForWriteWatchDirty)
                {
                    objectAddress = pageStart + AutoSystemInfo::PageSize;
                    continue;
                }

                // We're interested in only rescanning the parts of the object that have changed, not the whole
                // object. So just queue that up for marking
                char * checkEnd = min(pageStart + AutoSystemInfo::PageSize, objectAddressEnd);

#ifdef RECYCLER_VISITED_HOST
                if (tracedObject)
                {
                    // The object has one dirty page so we need to trace it
                    if (!recycler->AddPreciselyTracedMark(reinterpret_cast<IRecyclerVisitedObject*>(objectAddressStart)))
                    {
                        this->SetNeedOOMRescan(recycler);
#ifdef RECYCLER_PAGE_HEAP
                        if (!header->isObjectPageLocked)
#endif
                        {
                            header->markOnOOMRescan = true;
                        }
                    }
                    else
                    {
                        // Object has been successfully processed, so clear NewTrackBit
                        header->SetAttributes(recycler->Cookie, (attributes & ~NewTrackBit));
                        RECYCLER_STATS_INTERLOCKED_INC(recycler, trackCount);
                    }

                    rescanCount = objectSize / AutoSystemInfo::PageSize +
                        (objectSize % AutoSystemInfo::PageSize != 0 ? 1 : 0);
#ifdef RECYCLER_STATS
                    objectScanned = true;
                    recycler->collectionStats.markData.rescanLargePageCount += rescanCount;
                    recycler->collectionStats.markData.rescanLargeByteCount += objectSize;
#endif
                    // We don't need to continue as we are tracing the whole object
                    break;
                }
                else
#endif
                {
                    Assert(!(attributes & TrackBit));
                    if (!recycler->AddMark(objectAddress, (checkEnd - objectAddress)))
                    {
                        this->SetNeedOOMRescan(recycler);
#ifdef RECYCLER_PAGE_HEAP
                        if (!header->isObjectPageLocked)
#endif
                        {
                            header->markOnOOMRescan = true;
                        }
                    }

#ifdef RECYCLER_STATS
                    objectScanned = true;
                    recycler->collectionStats.markData.rescanLargePageCount++;
                    recycler->collectionStats.markData.rescanLargeByteCount += (checkEnd - objectAddress);
#endif
                }

                objectAddress = checkEnd;
                rescanCount++;
            }
            while (objectAddress < objectAddressEnd);
        }
#else
        else
        {
            Assert(recycler->inEndMarkOnLowMemory);
        }
#endif
        RECYCLER_STATS_ADD(recycler, markData.rescanLargeObjectCount, objectScanned);
    }

    return rescanCount;
}